

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  long in_RSI;
  char *pcVar3;
  int iVar4;
  EVP_PKEY_CTX *in_RDI;
  undefined8 uVar5;
  char *pcVar6;
  int i;
  FILE *infile;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar7;
  FILE *local_18;
  
  iVar4 = (int)in_RDI;
  init(in_RDI);
  local_18 = _stdin;
  cur_file = "stdin";
  iVar7 = 1;
  do {
    if (iVar4 <= iVar7) {
      if (local_18 != (FILE *)0x0) {
        yyrestart((FILE *)CONCAT44(iVar7,in_stack_ffffffffffffffe0));
        yyparse();
      }
      return error_state;
    }
    cur_file = *(char **)(in_RSI + (long)iVar7 * 8);
    local_18 = fopen(*(char **)(in_RSI + (long)iVar7 * 8),"r");
    if (local_18 == (FILE *)0x0) {
      iVar1 = strcmp(*(char **)(in_RSI + (long)iVar7 * 8),"--help");
      if (iVar1 == 0) {
        usage();
        goto LAB_001081c0;
      }
      iVar1 = strcmp(*(char **)(in_RSI + (long)iVar7 * 8),"-");
      if (iVar1 == 0) {
        iVar1 = restorestdin();
        if (iVar1 != -1) {
          cur_file = "stdin";
          local_18 = _stdin;
          goto LAB_001081c0;
        }
      }
      else {
        warn("%s",*(undefined8 *)(in_RSI + (long)iVar7 * 8));
        if (iVar4 != 2) {
          fputc(10,_stderr);
        }
      }
    }
    else {
LAB_001081c0:
      yyrestart((FILE *)CONCAT44(iVar7,in_stack_ffffffffffffffe0));
      fflush(_stdout);
      fflush(_stderr);
      if (iVar4 != 2) {
        pcVar3 = "";
        if (stdout_in_tty != 0) {
          pcVar3 = "\x1b[1m";
        }
        uVar2 = 0x28;
        if (local_18 != _stdin) {
          uVar2 = 0x22;
        }
        uVar5 = 0x29;
        if (local_18 != _stdin) {
          uVar5 = 0x22;
        }
        pcVar6 = "";
        if (stdout_in_tty != 0) {
          pcVar6 = "\x1b[0m";
        }
        printf("%sFile name: %c%s%c%s\n",pcVar3,uVar2,cur_file,uVar5,pcVar6);
      }
      yyparse();
      if (error_state == 0) {
        semchecker();
      }
      if (iVar4 != 2) {
        putchar(10);
      }
      if (local_18 != _stdin) {
        fclose(local_18);
      }
      restart();
    }
    local_18 = (FILE *)0x0;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
#if COMPILER_VERSION >= 3
    if (argc < 3)
        usage();
    FILE *infile = fopen(argv[1], "r");
    if (!infile)
        err(EXIT_FAILURE, "%s", argv[1]);
    output_file = argv[2];
    yyrestart(infile);
    yyparse();
    if (!error_state)
        semchecker();
    if (!error_state) {
        genIR();
#if COMPILER_VERSION >= 4
        genCode();
#endif
    }
#else
    init();
    FILE *infile = stdin; /* use stdin if no arg supplied */
    cur_file = "stdin";
    int i;
    for (i = 1; i < argc; i++) {
        cur_file = argv[i];
        if (!(infile = fopen(argv[i], "r"))) {
            if (strcmp(argv[i], "--help") == 0)
                usage();
            else if (strcmp(argv[i], "-") == 0) {
                if (restorestdin() == -1)
                    continue;
                cur_file = "stdin";
                infile = stdin;
            } else {
                warn("%s", argv[i]);
                if (argc != 2) fputc('\n', stderr);
                continue;
            }
        }
        yyrestart(infile);
        fflush(stdout);
        fflush(stderr);
        if (argc != 2) {
            printf("%sFile name: %c%s%c%s\n",
                   stdout_in_tty ? "\033[1m" : "",
                   infile != stdin ? '"' : '(', cur_file,
                   infile != stdin ? '"' : ')',
                   stdout_in_tty ? "\033[0m" : "");
        }
        yyparse();
#if COMPILER_VERSION >= 2
        if (!error_state)
            semchecker();
#endif
        if (argc != 2) putchar('\n');
        if (infile != stdin) fclose(infile);
        infile = NULL;
        restart();
    }
    if (infile) { /* no args, read stdin */
        yyrestart(infile);
        yyparse();
    }
#endif
    return error_state;
}